

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterYs<unsigned_long_long>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>
               (GetterYs<unsigned_long_long> *getter1,GetterYRef *getter2,
               TransformerLinLog *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  float fVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  GetterYRef *local_50;
  TransformerLinLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  pIVar12 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>>
              ((LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar15 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar15 = getter1->Count;
    }
    if (0 < iVar15) {
      iVar16 = 0;
      dVar9 = 0.0;
      do {
        pIVar13 = GImPlot;
        dVar8 = getter1->X0;
        dVar11 = getter1->XScale;
        iVar5 = getter1->Count;
        uVar2 = *(unsigned_long_long *)
                 ((long)getter1->Ys +
                 (long)(((getter1->Offset + iVar16) % iVar5 + iVar5) % iVar5) *
                 (long)getter1->Stride);
        dVar7 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25)
                      + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        pIVar14 = GImPlot;
        iVar5 = transformer->YAxis;
        pIVar6 = pIVar13->CurrentPlot;
        dVar3 = pIVar6->YAxis[iVar5].Range.Min;
        IVar4 = pIVar13->PixelRange[iVar5].Min;
        local_58._4_4_ =
             (float)(pIVar13->My[iVar5] *
                     ((dVar3 + (double)(float)(dVar7 / pIVar13->LogDenY[iVar5]) *
                               (pIVar6->YAxis[iVar5].Range.Max - dVar3)) - dVar3) + (double)IVar4.y)
        ;
        local_58._0_4_ =
             (float)(pIVar13->Mx * ((dVar8 + dVar9 * dVar11) - (pIVar6->XAxis).Range.Min) +
                    (double)IVar4.x);
        dVar11 = getter2->XScale;
        dVar3 = getter2->X0;
        dVar8 = log10(getter2->YRef / GImPlot->CurrentPlot->YAxis[iVar5].Range.Min);
        iVar5 = transformer->YAxis;
        pIVar6 = pIVar14->CurrentPlot;
        dVar7 = pIVar6->YAxis[iVar5].Range.Min;
        IVar4 = pIVar14->PixelRange[iVar5].Min;
        fVar17 = (float)(pIVar14->Mx * ((dVar3 + dVar9 * dVar11) - (pIVar6->XAxis).Range.Min) +
                        (double)IVar4.x);
        fVar18 = (float)(pIVar14->My[iVar5] *
                         ((dVar7 + (double)(float)(dVar8 / pIVar14->LogDenY[iVar5]) *
                                   (pIVar6->YAxis[iVar5].Range.Max - dVar7)) - dVar7) +
                        (double)IVar4.y);
        local_60.y = fVar18;
        local_60.x = fVar17;
        pIVar6 = pIVar12->CurrentPlot;
        fVar10 = (float)local_58._4_4_;
        if (fVar18 <= (float)local_58._4_4_) {
          fVar10 = fVar18;
        }
        if ((fVar10 < (pIVar6->PlotRect).Max.y) &&
           (fVar10 = (float)(~-(uint)(fVar18 <= (float)local_58._4_4_) & (uint)fVar18 |
                            local_58._4_4_ & -(uint)(fVar18 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar10 && fVar10 != *pfVar1)) {
          fVar10 = (float)local_58._0_4_;
          if (fVar17 <= (float)local_58._0_4_) {
            fVar10 = fVar17;
          }
          if ((fVar10 < (pIVar6->PlotRect).Max.x) &&
             (fVar10 = (float)(-(uint)(fVar17 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar17 <= (float)local_58._0_4_) & (uint)fVar17),
             (pIVar6->PlotRect).Min.x <= fVar10 && fVar10 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        dVar9 = dVar9 + 1.0;
        iVar16 = iVar16 + 1;
      } while (iVar15 != iVar16);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}